

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O2

void __thiscall QMainWindow::setIconSize(QMainWindow *this,QSize *iconSize)

{
  long lVar1;
  QStyle *pQVar2;
  QSize QVar3;
  ulong uVar4;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  QVar3 = *iconSize;
  if (((ulong)QVar3 & 0x8000000080000000) == 0) {
    uVar4 = (ulong)QVar3 >> 0x20;
  }
  else {
    pQVar2 = QWidget::style(&this->super_QWidget);
    QVar3 = (QSize)(**(code **)(*(long *)pQVar2 + 0xe0))(pQVar2,0x3b,0,this);
    uVar4 = (ulong)QVar3 & 0xffffffff;
  }
  if ((*(int *)(lVar1 + 0x268) != QVar3.wd.m_i.m_i) || (*(int *)(lVar1 + 0x26c) != (int)uVar4)) {
    *(QSize *)(lVar1 + 0x268) = (QSize)((ulong)QVar3 & 0xffffffff | uVar4 << 0x20);
    iconSizeChanged(this,(QSize *)(lVar1 + 0x268));
  }
  *(bool *)(lVar1 + 0x270) = -1 < ((iconSize->ht).m_i | (iconSize->wd).m_i);
  return;
}

Assistant:

void QMainWindow::setIconSize(const QSize &iconSize)
{
    Q_D(QMainWindow);
    QSize sz = iconSize;
    if (!sz.isValid()) {
        const int metric = style()->pixelMetric(QStyle::PM_ToolBarIconSize, nullptr, this);
        sz = QSize(metric, metric);
    }
    if (d->iconSize != sz) {
        d->iconSize = sz;
        emit iconSizeChanged(d->iconSize);
    }
    d->explicitIconSize = iconSize.isValid();
}